

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfStdIO.cpp
# Opt level: O0

ofstream * Imf_3_4::anon_unknown_2::make_ofstream(char *filename)

{
  ofstream *__source;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar1;
  openmode in_stack_ffffffffffffffc4;
  path *in_stack_ffffffffffffffc8;
  basic_ofstream<char,_std::char_traits<char>_> *in_stack_ffffffffffffffd0;
  
  __source = (ofstream *)operator_new(0x200);
  uVar1 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
  std::filesystem::__cxx11::u8path<char_const*,std::filesystem::__cxx11::path,char>
            ((char **)__source);
  std::operator|(_S_out,_S_bin);
  std::ofstream::ofstream<std::filesystem::__cxx11::path,std::filesystem::__cxx11::path>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4);
  std::filesystem::__cxx11::path::~path
            ((path *)(CONCAT44(in_stack_ffffffffffffffc4,uVar1) & 0xffffffff00ffffff));
  return __source;
}

Assistant:

inline ofstream*
make_ofstream (const char* filename)
{
#if __cplusplus >= 202002L
    auto u8view = ranges::views::transform (span{filename, strlen(filename)},
                                            [](char c) -> char8_t { return c; });
    return new ofstream (filesystem::path (u8view.begin (), u8view.end ()),
                         ios_base::out | ios_base::binary);
#else
    return new ofstream (filesystem::u8path (filename),
                         ios_base::out | ios_base::binary);
#endif
}